

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O1

void __thiscall
DelIRCCommand::trigger
          (DelIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined8 *puVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  if (parameters._M_len == 0) {
    pcVar6 = "Error: Too few parameters. Syntax: del <player>";
    uVar5 = 0x2f;
LAB_0010fddf:
    Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar5,pcVar6);
    return;
  }
  lVar3 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar3 == 0) {
    return;
  }
  Jupiter::IRC::Client::Channel::getType();
  RenX::getCore();
  lVar3 = RenX::Core::getServerCount();
  if (lVar3 != 0) {
    uVar7 = 1;
    do {
      uVar4 = RenX::getCore();
      uVar5 = RenX::Core::getServer(uVar4);
      cVar2 = RenX::Server::isLogChanType((int)uVar5);
      if (cVar2 != '\0') {
        lVar3 = RenX::Server::getPlayerByPartName(uVar5,parameters._M_len,parameters._M_str);
        if (lVar3 == 0) {
          cVar2 = Jupiter::Config::removeSection(0x118440,parameters._M_len,parameters._M_str);
          if ((cVar2 == '\0') || (cVar2 = Jupiter::Config::write(), cVar2 == '\0')) {
            Jupiter::Plugin::getConfig();
            lVar3 = Jupiter::Config::getSections_abi_cxx11_();
            for (puVar1 = *(undefined8 **)(lVar3 + 0x10); puVar1 != (undefined8 *)0x0;
                puVar1 = (undefined8 *)*puVar1) {
              lhs = (basic_string_view<char,_std::char_traits<char>_>)
                    Jupiter::Config::get(puVar1 + 5,4,"Name",0,0);
              bVar8 = jessilib::equalsi<char,char>(lhs,parameters);
              if (bVar8) {
                cVar2 = Jupiter::Config::removeSection(0x118440,puVar1[2],puVar1[1]);
                if (cVar2 != '\0') {
                  Jupiter::Config::write();
                }
                Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str);
                if (bVar8) {
                  return;
                }
              }
            }
            pcVar6 = "Error: Player not found.";
            uVar5 = 0x18;
          }
          else {
            pcVar6 = "Player has been removed from the moderator list.";
            uVar5 = 0x30;
          }
          goto LAB_0010fddf;
        }
        if (*(char *)(lVar3 + 0x100) == '\x01') {
          pcVar6 = "Error: A bot can not be a moderator.";
        }
        else {
          cVar2 = Jupiter::Config::removeSection
                            (0x118440,*(undefined8 *)(lVar3 + 0x70),*(undefined8 *)(lVar3 + 0x68));
          if ((cVar2 != '\0') && (cVar2 = Jupiter::Config::write(), cVar2 != '\0')) {
            pcVar6 = "Player has been removed from the moderator list.";
            uVar5 = 0x30;
            goto LAB_0010fddf;
          }
          pcVar6 = "Player is not in the moderator list.";
        }
        uVar5 = 0x24;
        goto LAB_0010fddf;
      }
      RenX::getCore();
      uVar4 = RenX::Core::getServerCount();
      bVar8 = uVar4 != uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar8);
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel._M_len,channel._M_str,0x40,
             "Error: Channel not attached to any connected Renegade X servers.");
  return;
}

Assistant:

void DelIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string_view parameters_view = parameters;
	if (parameters.empty())
		source->sendNotice(nick, "Error: Too few parameters. Syntax: del <player>"sv);
	else
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			RenX::Server *server;
			RenX::PlayerInfo *player;
			int type = chan->getType();
			bool serverMatch = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					serverMatch = true;
					player = server->getPlayerByPartName(parameters);
					if (player == nullptr)
					{
						if (pluginInstance.removeModSection(parameters))
							source->sendNotice(nick, "Player has been removed from the moderator list."sv);
						else
						{
							for (auto& section : pluginInstance.getConfig().getSections())
							{
								if (jessilib::equalsi(section.second.get("Name"sv), parameters_view)) {
									if (pluginInstance.removeModSection(section.first))
										source->sendNotice(nick, "Player has been removed from the moderator list."sv);
									else
										source->sendNotice(nick, "Error: Unknown error occurred."sv);

									return;
								}
							}

							source->sendNotice(nick, "Error: Player not found."sv);
						}
					}
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (pluginInstance.removeModSection(player->uuid))
						source->sendNotice(nick, "Player has been removed from the moderator list."sv);
					else
						source->sendNotice(nick, "Player is not in the moderator list."sv);

					break;
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}